

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
::find_position<HashObject<256,32>>
          (sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
           *this,HashObject<256,_32> *key)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  const_reference ppVar4;
  ulong uVar5;
  ulong i;
  long lVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  lVar1 = *(long *)(this + 0x140);
  sVar3 = HashObject<256,_32>::Hash(key);
  uVar7 = 0xffffffffffffffff;
  lVar6 = 0;
  do {
    i = sVar3 & lVar1 - 1U;
    bVar2 = sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            ::test((sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                    *)(this + 0x128),i);
    if (!bVar2) {
      uVar5 = i;
      if (uVar7 != 0xffffffffffffffff) {
        uVar5 = uVar7;
      }
      i = 0xffffffffffffffff;
LAB_00147a86:
      pVar8.second = uVar5;
      pVar8.first = i;
      return pVar8;
    }
    bVar2 = sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            ::test_deleted((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                            *)this,i);
    if (bVar2) {
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = i;
      }
    }
    else {
      ppVar4 = sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::unsafe_get((sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                             *)(this + 0x128),i);
      if (key->i_ == (ppVar4->first).i_) {
        uVar5 = 0xffffffffffffffff;
        goto LAB_00147a86;
      }
    }
    sVar3 = i + lVar6 + 1;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }